

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

void google::protobuf::compiler::objectivec::anon_unknown_0::PathSplit
               (string *path,string *directory,string *basename)

{
  long lVar1;
  long *local_48 [2];
  long local_38 [2];
  
  lVar1 = std::__cxx11::string::rfind((char)path,0x2f);
  if (lVar1 == -1) {
    if (directory != (string *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)directory,0,(char *)directory->_M_string_length,0x352e62);
    }
    if (basename != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)basename);
      return;
    }
  }
  else {
    if (directory != (string *)0x0) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)path);
      std::__cxx11::string::operator=((string *)directory,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    if (basename != (string *)0x0) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)path);
      std::__cxx11::string::operator=((string *)basename,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void PathSplit(const string& path, string* directory, string* basename) {
  string::size_type last_slash = path.rfind('/');
  if (last_slash == string::npos) {
    if (directory) {
      *directory = "";
    }
    if (basename) {
      *basename = path;
    }
  } else {
    if (directory) {
      *directory = path.substr(0, last_slash);
    }
    if (basename) {
      *basename = path.substr(last_slash + 1);
    }
  }
}